

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::ToolBarLayout::minimumSize(ToolBarLayout *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  const_reference ppQVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  QMargins m;
  QSize local_30;
  QSize buttonSize;
  QSize arrowSize;
  int height;
  int width;
  ToolBarLayout *this_local;
  
  buttonSize = (QSize)(**(code **)(*(long *)this->left + 0x10))();
  QSize::QSize(&local_30);
  bVar1 = QList<QLayoutItem_*>::isEmpty(&this->buttons);
  if (bVar1) {
    iVar2 = FingerGeometry::width();
    iVar3 = FingerGeometry::height();
    QSize::QSize((QSize *)&m.m_right,iVar2,iVar3);
    local_30.wd = m.m_right;
    local_30.ht = m.m_bottom;
  }
  else {
    ppQVar6 = QList<QLayoutItem_*>::at(&this->buttons,0);
    local_30 = (QSize)(**(code **)(*(long *)*ppQVar6 + 0x10))();
  }
  auVar8 = QLayout::contentsMargins();
  m._0_8_ = auVar8._8_8_;
  local_50 = auVar8._0_8_;
  if (this->orient == Horizontal) {
    iVar2 = QSize::width(&buttonSize);
    iVar3 = QSize::width(&local_30);
    iVar4 = QMargins::left((QMargins *)local_50);
    iVar5 = QMargins::right((QMargins *)local_50);
    arrowSize.ht = iVar2 * 2 + iVar3 * 2 + iVar4 + iVar5;
    local_54 = QSize::height(&buttonSize);
    local_58 = QSize::height(&local_30);
    piVar7 = qMax<int>(&local_54,&local_58);
    iVar2 = *piVar7;
    iVar3 = QMargins::top((QMargins *)local_50);
    iVar4 = QMargins::bottom((QMargins *)local_50);
    arrowSize.wd = iVar2 + iVar3 + iVar4;
  }
  else {
    iVar2 = QSize::height(&buttonSize);
    iVar3 = QSize::height(&local_30);
    iVar4 = QMargins::top((QMargins *)local_50);
    iVar5 = QMargins::bottom((QMargins *)local_50);
    arrowSize.wd = iVar2 * 2 + iVar3 * 2 + iVar4 + iVar5;
    local_5c = QSize::width(&buttonSize);
    local_60 = QSize::width(&local_30);
    piVar7 = qMax<int>(&local_5c,&local_60);
    iVar2 = *piVar7;
    iVar3 = QMargins::left((QMargins *)local_50);
    iVar4 = QMargins::right((QMargins *)local_50);
    arrowSize.ht = iVar2 + iVar3 + iVar4;
  }
  QSize::QSize((QSize *)&this_local,arrowSize.ht,arrowSize.wd);
  return (QSize)this_local;
}

Assistant:

QSize
ToolBarLayout::minimumSize() const
{
	int width = 0;
	int height = 0;

	const QSize arrowSize = left->sizeHint();

	QSize buttonSize;

	if( !buttons.isEmpty() )
		buttonSize = buttons.at( 0 )->sizeHint();
	else
		buttonSize = QSize( FingerGeometry::width(),
			FingerGeometry::height() );

	const QMargins m = contentsMargins();

	if( orient == Qt::Horizontal )
	{
		width = arrowSize.width() * 2 + buttonSize.width() * 2 + m.left() +
			m.right();
		height = qMax( arrowSize.height(), buttonSize.height() ) + m.top() +
			m.bottom();
	}
	else
	{
		height = arrowSize.height() * 2 + buttonSize.height() * 2 + m.top() +
			m.bottom();
		width = qMax( arrowSize.width(), buttonSize.width() ) + m.left() +
			m.right();
	}

	return QSize( width, height );
}